

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

uint32_t mp_decode_extl(char **data,int8_t *type)

{
  char cVar1;
  int8_t iVar2;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  
  pcVar5 = *data;
  cVar1 = *pcVar5;
  *data = pcVar5 + 1;
  switch(cVar1) {
  case -0x39:
    uVar4 = (uint)(byte)pcVar5[1];
    pcVar5 = pcVar5 + 2;
    break;
  case -0x38:
    uVar3 = *(ushort *)(pcVar5 + 1);
    *data = pcVar5 + 3;
    uVar4 = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
    goto LAB_00133501;
  case -0x37:
    uVar4 = *(uint *)(pcVar5 + 1);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    pcVar5 = pcVar5 + 5;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
  case -0x2c:
  case -0x2b:
  case -0x2a:
  case -0x29:
  case -0x28:
    uVar4 = 1 << (cVar1 + 0x2cU & 0x1f);
    goto LAB_00133501;
  }
  *data = pcVar5;
LAB_00133501:
  iVar2 = **data;
  *data = *data + 1;
  *type = iVar2;
  return uVar4;
}

Assistant:

MP_IMPL uint32_t
mp_decode_extl(const char **data, int8_t *type) {
	uint8_t c = mp_load_u8(data);
	uint32_t len;
	switch 	 (c) {
	case 0xd4:
	case 0xd5:
	case 0xd6:
	case 0xd7:
	case 0xd8:
		len = 1u << (c - 0xd4);
		break;
	case 0xc7:
		len = mp_load_u8(data);
		break;
	case 0xc8:
		len = mp_load_u16(data);
		break;
	case 0xc9:
		len = mp_load_u32(data);
		break;
	default:
		mp_unreachable();
	}
	*type = mp_load_u8(data);
	return len;
}